

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

bool __thiscall
tinyusdz::Attribute::get<std::__cxx11::string>
          (Attribute *this,double t,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *dst,
          TimeSampleInterpolationType tinterp)

{
  anon_struct_8_0_00000001_for___align aVar1;
  vtable_type *pvVar2;
  bool bVar3;
  uint32_t uVar4;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v;
  anon_struct_8_0_00000001_for___align local_70;
  long local_60;
  undefined8 uStack_58;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  if (dst == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return false;
  }
  if ((NAN(t)) &&
     (((this->_var)._blocked != false ||
      (((pvVar2 = (this->_var)._value.v_.vtable, pvVar2 == (vtable_type *)0x0 ||
        (uVar4 = (*pvVar2->type_id)(), uVar4 != 0)) &&
       ((pvVar2 = (this->_var)._value.v_.vtable, pvVar2 == (vtable_type *)0x0 ||
        (uVar4 = (*pvVar2->type_id)(), uVar4 != 1)))))))) {
    primvar::PrimVar::get_value<std::__cxx11::string>(&local_50,&this->_var);
    if (local_50.has_value_ == true) {
      aVar1 = (anon_struct_8_0_00000001_for___align)((long)&local_50.contained + 0x10);
      if (local_50.contained.data.__align == aVar1) {
        uStack_58 = local_50.contained._24_8_;
        local_70 = (anon_struct_8_0_00000001_for___align)&local_60;
      }
      else {
        local_70 = local_50.contained.data.__align;
      }
      local_60 = CONCAT71(local_50.contained._17_7_,local_50.contained._16_1_);
      local_50.contained._8_8_ = 0;
      local_50.contained._16_1_ = 0;
      local_50.contained.data.__align = aVar1;
    }
    if ((local_50.has_value_ == true) &&
       (::std::__cxx11::string::_M_assign((string *)dst),
       local_70 != (anon_struct_8_0_00000001_for___align)&local_60)) {
      operator_delete((void *)local_70,local_60 + 1);
    }
    if (local_50.has_value_ != false) {
      return true;
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    bVar3 = get_value<std::__cxx11::string>(this,dst);
  }
  else {
    bVar3 = primvar::PrimVar::get_interpolated_value<std::__cxx11::string>
                      (&this->_var,t,tinterp,dst);
  }
  return bVar3;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }